

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::extractLaneI64x2(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  undefined7 in_register_00000011;
  ulong uVar1;
  long lVar2;
  LaneArray<2> local_48;
  
  uVar1 = CONCAT71(in_register_00000011,index) & 0xffffffff;
  getLanesI64x2(&local_48,this);
  if ((byte)uVar1 < 2) {
    Literal(__return_storage_ptr__,local_48._M_elems + uVar1);
    lVar2 = 0x18;
    do {
      ~Literal((Literal *)((long)&local_48._M_elems[0].field_0 + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar1,2);
}

Assistant:

Literal Literal::extractLaneI64x2(uint8_t index) const {
  return getLanesI64x2().at(index);
}